

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimer.cpp
# Opt level: O1

void __thiscall QTimer::start(QTimer *this)

{
  QUntypedPropertyData *data;
  QObjectData *pQVar1;
  QBindingStatus *pQVar2;
  parameter_type pVar3;
  int iVar4;
  
  pQVar1 = (this->super_QObject).d_ptr.d;
  if (0 < (int)pQVar1[1].children.d.size) {
    stop(this);
  }
  pVar3 = QObjectCompatProperty<QTimerPrivate,_int,_&QTimerPrivate::_qt_property_inter_offset,_&QTimerPrivate::setInterval,_nullptr,_nullptr>
          ::value((QObjectCompatProperty<QTimerPrivate,_int,_&QTimerPrivate::_qt_property_inter_offset,_&QTimerPrivate::setInterval,_nullptr,_nullptr>
                   *)((long)&pQVar1[1].children.d.size + 4));
  data = (QUntypedPropertyData *)((long)&pQVar1[1].metaObject + 4);
  pQVar2 = (pQVar1->bindingStorage).bindingStatus;
  if ((pQVar2 != (QBindingStatus *)0x0) &&
     (pQVar2->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
    QBindingStorage::registerDependency_helper(&pQVar1->bindingStorage,data);
  }
  iVar4 = QObject::startTimer(&this->super_QObject,(nanoseconds)((long)pVar3 * 1000000),
                              *(TimerType *)data);
  if (0 < iVar4) {
    *(int *)&pQVar1[1].children.d.size = iVar4;
    QObjectComputedProperty<QTimerPrivate,_bool,_&QTimerPrivate::_qt_property_isActiveData_offset,_&QTimerPrivate::isActive>
    ::notify((QObjectComputedProperty<QTimerPrivate,_bool,_&QTimerPrivate::_qt_property_isActiveData_offset,_&QTimerPrivate::isActive>
              *)&pQVar1[1].bindingStorage);
    return;
  }
  return;
}

Assistant:

void QTimer::start()
{
    Q_D(QTimer);
    if (d->isActive()) // stop running timer
        stop();

    Qt::TimerId newId{ QObject::startTimer(d->inter * 1ms, d->type) }; // overflow impossible
    if (newId > Qt::TimerId::Invalid) {
        d->id = newId;
        d->isActiveData.notify();
    }
}